

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int write_VD_boot_record(archive_write *a)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  iso9660_conflict *iso9660;
  
  pvVar1 = a->format_data;
  lVar2 = *(long *)((long)pvVar1 + 0x102e0);
  *(undefined1 *)((long)pvVar1 + (0x102dc - lVar2)) = 0;
  *(undefined4 *)((long)pvVar1 + (0x102dd - lVar2)) = 0x30304443;
  *(undefined2 *)((long)pvVar1 + (0x102e1 - lVar2)) = 0x131;
  builtin_strncpy((char *)((long)pvVar1 + (0x102e3 - lVar2)),"EL TORIT",8);
  builtin_strncpy((char *)((long)pvVar1 + (0x102eb - lVar2)),"O SPECIF",8);
  *(undefined8 *)((long)pvVar1 + (0x102f2 - lVar2)) = 0x4e4f495441434946;
  *(undefined8 *)((long)pvVar1 + (0x102fa - lVar2)) = 0;
  *(undefined8 *)((long)pvVar1 + (0x10302 - lVar2)) = 0;
  *(undefined8 *)((long)pvVar1 + (0x1030a - lVar2)) = 0;
  *(undefined8 *)((long)pvVar1 + (0x10312 - lVar2)) = 0;
  *(undefined8 *)((long)pvVar1 + (0x10313 - lVar2)) = 0;
  *(undefined8 *)((long)pvVar1 + (0x1031b - lVar2)) = 0;
  *(undefined4 *)((long)pvVar1 + (0x10323 - lVar2)) =
       *(undefined4 *)(*(long *)(*(long *)((long)pvVar1 + 0x10320) + 0x18) + 0xa4);
  memset((void *)((long)pvVar1 + (0x10327 - lVar2)),0,0x7b5);
  iVar3 = wb_consume(a,0x800);
  return iVar3;
}

Assistant:

static int
write_VD_boot_record(struct archive_write *a)
{
	struct iso9660 *iso9660;
	unsigned char *bp;

	iso9660 = a->format_data;
	bp = wb_buffptr(a) -1;
	/* Volume Descriptor Type */
	set_VD_bp(bp, VDT_BOOT_RECORD, 1);
	/* Boot System Identifier */
	memcpy(bp+8, "EL TORITO SPECIFICATION", 23);
	set_unused_field_bp(bp, 8+23, 39);
	/* Unused */
	set_unused_field_bp(bp, 40, 71);
	/* Absolute pointer to first sector of Boot Catalog */
	set_num_731(bp+72,
	    iso9660->el_torito.catalog->file->content.location);
	/* Unused */
	set_unused_field_bp(bp, 76, LOGICAL_BLOCK_SIZE);

	return (wb_consume(a, LOGICAL_BLOCK_SIZE));
}